

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildAndTestHandler.cxx
# Opt level: O3

int __thiscall
cmCTestBuildAndTestHandler::ProcessCommandLineArguments
          (cmCTestBuildAndTestHandler *this,string *currentArg,size_t *idx,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *allArgs)

{
  string *in_path;
  cmCTest *this_00;
  int iVar1;
  size_t sVar2;
  pointer pbVar3;
  ulong uVar4;
  ulong uVar5;
  string *path;
  double dVar6;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  basic_string_view<char,_std::char_traits<char>_> __str_02;
  basic_string_view<char,_std::char_traits<char>_> __str_03;
  basic_string_view<char,_std::char_traits<char>_> __str_04;
  basic_string_view<char,_std::char_traits<char>_> __str_05;
  basic_string_view<char,_std::char_traits<char>_> __str_06;
  basic_string_view<char,_std::char_traits<char>_> __str_07;
  basic_string_view<char,_std::char_traits<char>_> __str_08;
  basic_string_view<char,_std::char_traits<char>_> __str_09;
  basic_string_view<char,_std::char_traits<char>_> __str_10;
  basic_string_view<char,_std::char_traits<char>_> __str_11;
  ostringstream cmCTestLog_msg;
  long *local_1c8;
  long local_1b8 [2];
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_1a8[0]._M_string_length = (size_type)(currentArg->_M_dataplus)._M_p;
  local_1a8[0]._M_dataplus._M_p = (pointer)currentArg->_M_string_length;
  __str._M_str = "--build-and-test";
  __str._M_len = 0x10;
  iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_1a8,0,0x10,__str);
  if (iVar1 == 0) {
    uVar5 = *idx;
    uVar4 = (long)(allArgs->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(allArgs->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5;
    if (uVar5 < uVar4 - 1) {
      if (uVar4 <= uVar5 + 2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"--build-and-test must have source and binary dir",0x30);
        std::ios::widen((char)local_1a8 +
                        (char)*(undefined8 *)(local_1a8[0]._M_dataplus._M_p + -0x18));
        std::ostream::put((char)local_1a8);
        std::ostream::flush();
        this_00 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(this_00,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildAndTestHandler.cxx"
                     ,400,(char *)local_1c8,false);
        if (local_1c8 != local_1b8) {
          operator_delete(local_1c8,local_1b8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        return 0;
      }
      *idx = uVar5 + 1;
      in_path = &this->SourceDir;
      std::__cxx11::string::_M_assign((string *)in_path);
      *idx = *idx + 1;
      path = &this->BinaryDir;
      std::__cxx11::string::_M_assign((string *)path);
      cmsys::SystemTools::MakeDirectory(path,(mode_t *)0x0);
      cmsys::SystemTools::CollapseFullPath(local_1a8,path);
      std::__cxx11::string::operator=((string *)path,(string *)local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      cmsys::SystemTools::CollapseFullPath(local_1a8,in_path);
      std::__cxx11::string::operator=((string *)in_path,(string *)local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
    }
  }
  local_1a8[0]._M_string_length = (size_type)(currentArg->_M_dataplus)._M_p;
  local_1a8[0]._M_dataplus._M_p = (pointer)currentArg->_M_string_length;
  __str_00._M_str = "--build-target";
  __str_00._M_len = 0xe;
  iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_1a8,0,0xe,__str_00);
  if (iVar1 == 0) {
    pbVar3 = (allArgs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (*idx < ((long)(allArgs->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5) - 1U) {
      sVar2 = *idx + 1;
      *idx = sVar2;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->BuildTargets,pbVar3 + sVar2);
    }
  }
  local_1a8[0]._M_string_length = (size_type)(currentArg->_M_dataplus)._M_p;
  local_1a8[0]._M_dataplus._M_p = (pointer)currentArg->_M_string_length;
  __str_01._M_str = "--build-nocmake";
  __str_01._M_len = 0xf;
  iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_1a8,0,0xf,__str_01);
  if (iVar1 == 0) {
    this->BuildNoCMake = true;
  }
  local_1a8[0]._M_string_length = (size_type)(currentArg->_M_dataplus)._M_p;
  local_1a8[0]._M_dataplus._M_p = (pointer)currentArg->_M_string_length;
  __str_02._M_str = "--build-run-dir";
  __str_02._M_len = 0xf;
  iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_1a8,0,0xf,__str_02);
  if ((iVar1 == 0) &&
     (*idx < ((long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    *idx = *idx + 1;
    std::__cxx11::string::_M_assign((string *)&this->BuildRunDir);
  }
  local_1a8[0]._M_string_length = (size_type)(currentArg->_M_dataplus)._M_p;
  local_1a8[0]._M_dataplus._M_p = (pointer)currentArg->_M_string_length;
  __str_03._M_str = "--build-two-config";
  __str_03._M_len = 0x12;
  iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_1a8,0,0x12,__str_03);
  if (iVar1 == 0) {
    this->BuildTwoConfig = true;
  }
  local_1a8[0]._M_string_length = (size_type)(currentArg->_M_dataplus)._M_p;
  local_1a8[0]._M_dataplus._M_p = (pointer)currentArg->_M_string_length;
  __str_04._M_str = "--build-exe-dir";
  __str_04._M_len = 0xf;
  iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_1a8,0,0xf,__str_04);
  if ((iVar1 == 0) &&
     (*idx < ((long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    *idx = *idx + 1;
    std::__cxx11::string::_M_assign((string *)&this->ExecutableDirectory);
  }
  local_1a8[0]._M_string_length = (size_type)(currentArg->_M_dataplus)._M_p;
  local_1a8[0]._M_dataplus._M_p = (pointer)currentArg->_M_string_length;
  __str_05._M_str = "--test-timeout";
  __str_05._M_len = 0xe;
  iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_1a8,0,0xe,__str_05);
  if (iVar1 == 0) {
    pbVar3 = (allArgs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (*idx < ((long)(allArgs->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5) - 1U) {
      sVar2 = *idx + 1;
      *idx = sVar2;
      dVar6 = atof(pbVar3[sVar2]._M_dataplus._M_p);
      (this->Timeout).__r = dVar6;
    }
  }
  iVar1 = std::__cxx11::string::compare((char *)currentArg);
  if ((iVar1 == 0) &&
     (*idx < ((long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    *idx = *idx + 1;
    std::__cxx11::string::_M_assign((string *)&this->BuildGenerator);
  }
  iVar1 = std::__cxx11::string::compare((char *)currentArg);
  if ((iVar1 == 0) &&
     (*idx < ((long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    *idx = *idx + 1;
    std::__cxx11::string::_M_assign((string *)&this->BuildGeneratorPlatform);
  }
  iVar1 = std::__cxx11::string::compare((char *)currentArg);
  if ((iVar1 == 0) &&
     (*idx < ((long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    *idx = *idx + 1;
    std::__cxx11::string::_M_assign((string *)&this->BuildGeneratorToolset);
  }
  local_1a8[0]._M_string_length = (size_type)(currentArg->_M_dataplus)._M_p;
  local_1a8[0]._M_dataplus._M_p = (pointer)currentArg->_M_string_length;
  __str_06._M_str = "--build-project";
  __str_06._M_len = 0xf;
  iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_1a8,0,0xf,__str_06);
  if ((iVar1 == 0) &&
     (*idx < ((long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    *idx = *idx + 1;
    std::__cxx11::string::_M_assign((string *)&this->BuildProject);
  }
  local_1a8[0]._M_string_length = (size_type)(currentArg->_M_dataplus)._M_p;
  local_1a8[0]._M_dataplus._M_p = (pointer)currentArg->_M_string_length;
  __str_07._M_str = "--build-makeprogram";
  __str_07._M_len = 0x13;
  iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_1a8,0,0x13,__str_07);
  if ((iVar1 == 0) &&
     (*idx < ((long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    *idx = *idx + 1;
    std::__cxx11::string::_M_assign((string *)&this->BuildMakeProgram);
  }
  local_1a8[0]._M_string_length = (size_type)(currentArg->_M_dataplus)._M_p;
  local_1a8[0]._M_dataplus._M_p = (pointer)currentArg->_M_string_length;
  __str_08._M_str = "--build-config-sample";
  __str_08._M_len = 0x15;
  iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_1a8,0,0x15,__str_08);
  if ((iVar1 == 0) &&
     (*idx < ((long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    *idx = *idx + 1;
    std::__cxx11::string::_M_assign((string *)&this->ConfigSample);
  }
  local_1a8[0]._M_string_length = (size_type)(currentArg->_M_dataplus)._M_p;
  local_1a8[0]._M_dataplus._M_p = (pointer)currentArg->_M_string_length;
  __str_09._M_str = "--build-noclean";
  __str_09._M_len = 0xf;
  iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_1a8,0,0xf,__str_09);
  if (iVar1 == 0) {
    this->BuildNoClean = true;
  }
  local_1a8[0]._M_string_length = (size_type)(currentArg->_M_dataplus)._M_p;
  local_1a8[0]._M_dataplus._M_p = (pointer)currentArg->_M_string_length;
  __str_10._M_str = "--build-options";
  __str_10._M_len = 0xf;
  iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_1a8,0,0xf,__str_10);
  if (iVar1 == 0) {
    uVar5 = *idx + 1;
    pbVar3 = (allArgs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (uVar5 < (ulong)((long)(allArgs->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5)) {
      do {
        iVar1 = std::__cxx11::string::compare((char *)(pbVar3 + uVar5));
        if ((iVar1 == 0) ||
           (iVar1 = std::__cxx11::string::compare
                              ((char *)((allArgs->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + *idx + 1)),
           iVar1 == 0)) break;
        sVar2 = *idx;
        *idx = sVar2 + 1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->BuildOptions,
                    (allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + sVar2 + 1);
        uVar5 = *idx + 1;
        pbVar3 = (allArgs->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      } while (uVar5 < (ulong)((long)(allArgs->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5
                              ));
    }
  }
  local_1a8[0]._M_string_length = (size_type)(currentArg->_M_dataplus)._M_p;
  local_1a8[0]._M_dataplus._M_p = (pointer)currentArg->_M_string_length;
  __str_11._M_str = "--test-command";
  __str_11._M_len = 0xe;
  iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_1a8,0,0xe,__str_11);
  if ((iVar1 == 0) &&
     (*idx < ((long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    *idx = *idx + 1;
    std::__cxx11::string::_M_assign((string *)&this->TestCommand);
    sVar2 = *idx + 1;
    pbVar3 = (allArgs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (sVar2 < (ulong)((long)(allArgs->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5)) {
      do {
        *idx = sVar2;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->TestCommandArgs,pbVar3 + sVar2);
        sVar2 = *idx + 1;
        pbVar3 = (allArgs->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      } while (sVar2 < (ulong)((long)(allArgs->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5
                              ));
    }
  }
  return 1;
}

Assistant:

int cmCTestBuildAndTestHandler::ProcessCommandLineArguments(
  const std::string& currentArg, size_t& idx,
  const std::vector<std::string>& allArgs)
{
  // --build-and-test options
  if (cmHasLiteralPrefix(currentArg, "--build-and-test") &&
      idx < allArgs.size() - 1) {
    if (idx + 2 < allArgs.size()) {
      idx++;
      this->SourceDir = allArgs[idx];
      idx++;
      this->BinaryDir = allArgs[idx];
      // dir must exist before CollapseFullPath is called
      cmSystemTools::MakeDirectory(this->BinaryDir);
      this->BinaryDir = cmSystemTools::CollapseFullPath(this->BinaryDir);
      this->SourceDir = cmSystemTools::CollapseFullPath(this->SourceDir);
    } else {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "--build-and-test must have source and binary dir"
                   << std::endl);
      return 0;
    }
  }
  if (cmHasLiteralPrefix(currentArg, "--build-target") &&
      idx < allArgs.size() - 1) {
    idx++;
    this->BuildTargets.push_back(allArgs[idx]);
  }
  if (cmHasLiteralPrefix(currentArg, "--build-nocmake")) {
    this->BuildNoCMake = true;
  }
  if (cmHasLiteralPrefix(currentArg, "--build-run-dir") &&
      idx < allArgs.size() - 1) {
    idx++;
    this->BuildRunDir = allArgs[idx];
  }
  if (cmHasLiteralPrefix(currentArg, "--build-two-config")) {
    this->BuildTwoConfig = true;
  }
  if (cmHasLiteralPrefix(currentArg, "--build-exe-dir") &&
      idx < allArgs.size() - 1) {
    idx++;
    this->ExecutableDirectory = allArgs[idx];
  }
  if (cmHasLiteralPrefix(currentArg, "--test-timeout") &&
      idx < allArgs.size() - 1) {
    idx++;
    this->Timeout = cmDuration(atof(allArgs[idx].c_str()));
  }
  if (currentArg == "--build-generator" && idx < allArgs.size() - 1) {
    idx++;
    this->BuildGenerator = allArgs[idx];
  }
  if (currentArg == "--build-generator-platform" && idx < allArgs.size() - 1) {
    idx++;
    this->BuildGeneratorPlatform = allArgs[idx];
  }
  if (currentArg == "--build-generator-toolset" && idx < allArgs.size() - 1) {
    idx++;
    this->BuildGeneratorToolset = allArgs[idx];
  }
  if (cmHasLiteralPrefix(currentArg, "--build-project") &&
      idx < allArgs.size() - 1) {
    idx++;
    this->BuildProject = allArgs[idx];
  }
  if (cmHasLiteralPrefix(currentArg, "--build-makeprogram") &&
      idx < allArgs.size() - 1) {
    idx++;
    this->BuildMakeProgram = allArgs[idx];
  }
  if (cmHasLiteralPrefix(currentArg, "--build-config-sample") &&
      idx < allArgs.size() - 1) {
    idx++;
    this->ConfigSample = allArgs[idx];
  }
  if (cmHasLiteralPrefix(currentArg, "--build-noclean")) {
    this->BuildNoClean = true;
  }
  if (cmHasLiteralPrefix(currentArg, "--build-options")) {
    while (idx + 1 < allArgs.size() && allArgs[idx + 1] != "--build-target" &&
           allArgs[idx + 1] != "--test-command") {
      ++idx;
      this->BuildOptions.push_back(allArgs[idx]);
    }
  }
  if (cmHasLiteralPrefix(currentArg, "--test-command") &&
      idx < allArgs.size() - 1) {
    ++idx;
    this->TestCommand = allArgs[idx];
    while (idx + 1 < allArgs.size()) {
      ++idx;
      this->TestCommandArgs.push_back(allArgs[idx]);
    }
  }
  return 1;
}